

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

int AF_DBlockThingsIterator_CreateFromPos
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double checkx;
  double checky;
  double checkz;
  double checkh;
  double checkradius;
  int iVar1;
  DBlockThingsIterator *this;
  DBlockThingsIterator *state;
  bool ignore;
  double radius;
  double h;
  double z;
  double y;
  double x;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x4c1,
                  "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param->field_0).field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x4c1,
                  "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  checkx = (param->field_0).f;
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x4c2,
                  "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x4c2,
                  "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  checky = param[1].field_0.f;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x4c3,
                  "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x4c3,
                  "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  checkz = param[2].field_0.f;
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x4c4,
                  "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type == '\x01') {
    checkh = param[3].field_0.f;
    if (numparam < 5) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                    ,0x4c5,
                    "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      __assert_fail("param[paramnum].Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                    ,0x4c5,
                    "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    checkradius = param[4].field_0.f;
    if (numparam < 6) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                    ,0x4c6,
                    "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[5].field_0.field_3.Type == '\0') {
      iVar1 = param[5].field_0.i;
      this = (DBlockThingsIterator *)DObject::operator_new((DObject *)0x218,(size_t)defaultparam);
      DBlockThingsIterator::DBlockThingsIterator
                (this,checkx,checky,checkz,checkh,checkradius,iVar1 != 0,(sector_t *)0x0);
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                        ,0x4c7,
                        "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetPointer(ret,this,1);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x4c6,
                  "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_FLOAT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                ,0x4c4,
                "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DBlockThingsIterator, CreateFromPos)
{
	PARAM_PROLOGUE;
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_FLOAT(h);
	PARAM_FLOAT(radius);
	PARAM_BOOL(ignore);
	ACTION_RETURN_OBJECT(new DBlockThingsIterator(x, y, z, h, radius, ignore, nullptr));
}